

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O2

void brotli::ClusterBlocks<brotli::Histogram<704>,unsigned_short>
               (unsigned_short *data,size_t length,uint8_t *block_ids)

{
  uint8_t uVar1;
  uint8_t uVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> histograms;
  vector<unsigned_int,_std::allocator<unsigned_int>_> block_index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram_symbols;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> clustered_histograms;
  Histogram<704> cur_histogram;
  
  histograms.super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  histograms.super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  histograms.super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&block_index,length,(allocator_type *)&cur_histogram);
  uVar4 = 0;
  memset(&cur_histogram,0,0xb08);
  cur_histogram.bit_cost_ = INFINITY;
  lVar6 = 0;
  do {
    cur_histogram.bit_cost_ = INFINITY;
    sVar3 = 1;
    do {
      sVar5 = sVar3;
      if (sVar5 + (lVar6 - length) == 1) {
        clustered_histograms.
        super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        clustered_histograms.
        super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        clustered_histograms.
        super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        histogram_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        histogram_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        histogram_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ClusterHistograms<brotli::Histogram<704>>
                  (&histograms,1,
                   ((long)histograms.
                          super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)histograms.
                         super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0xb10,0x100,
                   &clustered_histograms,&histogram_symbols);
        for (sVar3 = 0; length != sVar3; sVar3 = sVar3 + 1) {
          block_ids[sVar3] =
               (uint8_t)histogram_symbols.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [block_index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar3]];
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&histogram_symbols.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::_Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
        ~_Vector_base(&clustered_histograms.
                       super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                     );
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&block_index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::_Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
        ~_Vector_base(&histograms.
                       super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                     );
        return;
      }
      if ((lVar6 - length) + sVar5 == 0) {
        block_index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6 + (sVar5 - 1)] = uVar4;
        cur_histogram.data_[data[lVar6 + (sVar5 - 1)]] =
             cur_histogram.data_[data[lVar6 + (sVar5 - 1)]] + 1;
        break;
      }
      uVar1 = block_ids[sVar5 + lVar6 + -1];
      uVar2 = block_ids[sVar5 + lVar6];
      block_index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6 + (sVar5 - 1)] = uVar4;
      cur_histogram.data_[data[lVar6 + (sVar5 - 1)]] =
           cur_histogram.data_[data[lVar6 + (sVar5 - 1)]] + 1;
      cur_histogram.total_count_ = sVar5;
      sVar3 = sVar5 + 1;
    } while (uVar1 == uVar2);
    cur_histogram.total_count_ = sVar5;
    std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::push_back
              (&histograms,&cur_histogram);
    lVar6 = lVar6 + sVar5;
    memset(&cur_histogram,0,0xb08);
    cur_histogram.bit_cost_ = INFINITY;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void ClusterBlocks(const DataType* data, const size_t length,
                   uint8_t* block_ids) {
  std::vector<HistogramType> histograms;
  std::vector<uint32_t> block_index(length);
  uint32_t cur_idx = 0;
  HistogramType cur_histogram;
  for (size_t i = 0; i < length; ++i) {
    bool block_boundary = (i + 1 == length || block_ids[i] != block_ids[i + 1]);
    block_index[i] = cur_idx;
    cur_histogram.Add(data[i]);
    if (block_boundary) {
      histograms.push_back(cur_histogram);
      cur_histogram.Clear();
      ++cur_idx;
    }
  }
  std::vector<HistogramType> clustered_histograms;
  std::vector<uint32_t> histogram_symbols;
  // Block ids need to fit in one byte.
  static const size_t kMaxNumberOfBlockTypes = 256;
  ClusterHistograms(histograms, 1, histograms.size(),
                    kMaxNumberOfBlockTypes,
                    &clustered_histograms,
                    &histogram_symbols);
  for (size_t i = 0; i < length; ++i) {
    block_ids[i] = static_cast<uint8_t>(histogram_symbols[block_index[i]]);
  }
}